

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O2

void __thiscall
TPZSFMatrix<long_double>::TPZSFMatrix(TPZSFMatrix<long_double> *this,TPZSFMatrix<long_double> *A)

{
  longdouble lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  longdouble *plVar5;
  undefined4 extraout_var_01;
  longdouble *plVar6;
  longdouble *plVar7;
  
  iVar2 = (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(A);
  iVar3 = (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(A);
  TPZMatrix<long_double>::TPZMatrix
            (&this->super_TPZMatrix<long_double>,&PTR_PTR_0169e650,CONCAT44(extraout_var,iVar2),
             CONCAT44(extraout_var_00,iVar3));
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSFMatrix_0169e3d0;
  uVar4 = Size(this);
  plVar5 = (longdouble *)operator_new__(-(ulong)(uVar4 >> 0x3c != 0) | uVar4 << 4);
  this->fElem = plVar5;
  plVar7 = A->fElem;
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])(this);
  plVar6 = plVar5 + CONCAT44(extraout_var_01,iVar2);
  for (; plVar5 < plVar6; plVar5 = plVar5 + 1) {
    lVar1 = *plVar7;
    plVar7 = plVar7 + 1;
    *plVar5 = lVar1;
  }
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix (const TPZSFMatrix<TVar>  & A)
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar> ( A.Dim(), A.Dim() )
{
    int64_t size = Size();
	fElem = new TVar[size] ;
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Copia a matriz
	TVar *src = A.fElem;
	TVar *dst = fElem;
	TVar *end = &fElem[Size()];
	while ( dst < end )
		*dst++ = *src++;
}